

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall fmt::v10::detail::bigint::remove_leading_zeros(bigint *this)

{
  size_t sVar1;
  bigit *pbVar2;
  buffer<unsigned_int> *in_RDI;
  int num_bigits;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  uint7 in_stack_ffffffffffffffe0;
  undefined1 uVar3;
  int local_c;
  
  sVar1 = buffer<unsigned_int>::size(in_RDI);
  local_c = (int)sVar1;
  do {
    local_c = local_c + -1;
    uVar3 = false;
    if (0 < local_c) {
      pbVar2 = operator[]((bigint *)(ulong)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
      uVar3 = *pbVar2 == 0;
    }
  } while ((bool)uVar3 != false);
  to_unsigned<int>(0);
  basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_>::resize
            ((basic_memory_buffer<unsigned_int,_32UL,_std::allocator<unsigned_int>_> *)
             CONCAT17(uVar3,in_stack_ffffffffffffffe0),
             CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  return;
}

Assistant:

FMT_CONSTEXPR20 void remove_leading_zeros() {
    int num_bigits = static_cast<int>(bigits_.size()) - 1;
    while (num_bigits > 0 && (*this)[num_bigits] == 0) --num_bigits;
    bigits_.resize(to_unsigned(num_bigits + 1));
  }